

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WavLog.cpp
# Opt level: O2

void WavParserHelper::PrintRF64Header(RF64Header *wavHeader)

{
  RF64Chunk *pRVar1;
  ExtensibleFmtChunk *pEVar2;
  undefined8 uVar3;
  RF64Chunk rhs;
  ExtensibleFmtChunk rhs_00;
  DS64Chunk rhs_01;
  BextChunk rhs_02;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined8 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined8 uVar13;
  long lVar14;
  undefined1 *puVar15;
  undefined8 *puVar16;
  undefined1 *puVar17;
  undefined8 *puVar18;
  byte bVar19;
  undefined8 uVar20;
  undefined4 uVar21;
  char acVar22 [4];
  undefined4 uVar23;
  undefined8 in_stack_fffffffffffffa68;
  unsigned_long uVar24;
  undefined8 in_stack_fffffffffffffa70;
  unsigned_long uVar25;
  undefined8 in_stack_fffffffffffffa78;
  undefined8 uVar26;
  undefined8 in_stack_fffffffffffffa80;
  unsigned_long uVar27;
  undefined8 in_stack_fffffffffffffa88;
  undefined8 uVar28;
  undefined8 in_stack_fffffffffffffa90;
  undefined8 uVar29;
  undefined4 in_stack_fffffffffffffa98;
  undefined1 in_stack_fffffffffffffa9c [556];
  undefined1 local_2d0 [72];
  undefined8 local_288 [78];
  
  bVar19 = 0;
  pRVar1 = &wavHeader->RF64Chunk;
  uVar20 = *(undefined8 *)pRVar1;
  uVar3 = *(undefined8 *)((long)&(wavHeader->RF64Chunk).ckSize + 4);
  uVar4 = pRVar1->ckID[0];
  uVar5 = pRVar1->ckID[1];
  uVar6 = pRVar1->ckID[2];
  uVar7 = pRVar1->ckID[3];
  uVar8 = pRVar1->ckSize;
  rhs.ckSize = uVar8;
  rhs.ckID[3] = uVar7;
  rhs.ckID[2] = uVar6;
  rhs.ckID[1] = uVar5;
  rhs.ckID[0] = uVar4;
  uVar21 = (undefined4)uVar3;
  acVar22 = SUB84((ulong)uVar3 >> 0x20,0);
  rhs.rf64Type[0] = acVar22[0];
  rhs.rf64Type[1] = acVar22[1];
  rhs.rf64Type[2] = acVar22[2];
  rhs.rf64Type[3] = acVar22[3];
  PrintRF64Chunk(rhs);
  memcpy(local_2d0,&wavHeader->DS64Chunk,0x44);
  puVar15 = local_2d0;
  puVar17 = &stack0xfffffffffffffa58;
  for (lVar14 = 0x44; lVar14 != 0; lVar14 = lVar14 + -1) {
    *puVar17 = *puVar15;
    puVar15 = puVar15 + (ulong)bVar19 * -2 + 1;
    puVar17 = puVar17 + (ulong)bVar19 * -2 + 1;
  }
  rhs_01.ckSize._4_4_ = uVar21;
  rhs_01._0_8_ = uVar20;
  rhs_01.RIFFSizeLow._0_1_ = acVar22[0];
  rhs_01.RIFFSizeLow._1_1_ = acVar22[1];
  rhs_01.RIFFSizeLow._2_1_ = acVar22[2];
  rhs_01.RIFFSizeLow._3_1_ = acVar22[3];
  rhs_01._16_8_ = in_stack_fffffffffffffa68;
  rhs_01._24_8_ = in_stack_fffffffffffffa70;
  rhs_01._32_8_ = in_stack_fffffffffffffa78;
  rhs_01._40_8_ = in_stack_fffffffffffffa80;
  rhs_01._48_8_ = in_stack_fffffffffffffa88;
  rhs_01._56_8_ = in_stack_fffffffffffffa90;
  rhs_01.TableLength._4_4_ = in_stack_fffffffffffffa98;
  PrintDS64Chunk(rhs_01);
  pEVar2 = &wavHeader->fmtChunk;
  uVar20 = *(undefined8 *)&pEVar2->standardFmtChunk;
  uVar3 = *(undefined8 *)((long)&(wavHeader->fmtChunk).standardFmtChunk.ckSize + 4);
  uVar9 = (pEVar2->standardFmtChunk).ckID[0];
  uVar10 = (pEVar2->standardFmtChunk).ckID[1];
  uVar11 = (pEVar2->standardFmtChunk).ckID[2];
  uVar12 = (pEVar2->standardFmtChunk).ckID[3];
  uVar13 = (pEVar2->standardFmtChunk).ckSize;
  rhs_00.standardFmtChunk.ckSize = uVar13;
  rhs_00.standardFmtChunk.ckID[3] = uVar12;
  rhs_00.standardFmtChunk.ckID[2] = uVar11;
  rhs_00.standardFmtChunk.ckID[1] = uVar10;
  rhs_00.standardFmtChunk.ckID[0] = uVar9;
  uVar24 = (wavHeader->fmtChunk).standardFmtChunk.nSamplesPerSec;
  uVar25 = (wavHeader->fmtChunk).standardFmtChunk.nAvgBytesPerSec;
  uVar26 = *(undefined8 *)&(wavHeader->fmtChunk).standardFmtChunk.nBlockAlign;
  uVar27 = (wavHeader->fmtChunk).dwChannelMask;
  uVar28 = *(undefined8 *)(wavHeader->fmtChunk).SubFormat;
  uVar29 = *(undefined8 *)((wavHeader->fmtChunk).SubFormat + 8);
  uVar21 = (undefined4)uVar3;
  uVar23 = (undefined4)((ulong)uVar3 >> 0x20);
  rhs_00.standardFmtChunk.wFormatTag = (short)uVar23;
  rhs_00.standardFmtChunk.nChannels = (short)((uint)uVar23 >> 0x10);
  rhs_00.standardFmtChunk.nSamplesPerSec = uVar24;
  rhs_00.standardFmtChunk.nAvgBytesPerSec = uVar25;
  rhs_00.standardFmtChunk.nBlockAlign = (short)uVar26;
  rhs_00.standardFmtChunk.wBitsPerSample = (short)((ulong)uVar26 >> 0x10);
  rhs_00.cbSize = (short)((ulong)uVar26 >> 0x20);
  rhs_00.wValidBitsPerSample = (short)((ulong)uVar26 >> 0x30);
  rhs_00.dwChannelMask = uVar27;
  rhs_00.SubFormat[0] = (char)uVar28;
  rhs_00.SubFormat[1] = (char)((ulong)uVar28 >> 8);
  rhs_00.SubFormat[2] = (char)((ulong)uVar28 >> 0x10);
  rhs_00.SubFormat[3] = (char)((ulong)uVar28 >> 0x18);
  rhs_00.SubFormat[4] = (char)((ulong)uVar28 >> 0x20);
  rhs_00.SubFormat[5] = (char)((ulong)uVar28 >> 0x28);
  rhs_00.SubFormat[6] = (char)((ulong)uVar28 >> 0x30);
  rhs_00.SubFormat[7] = (char)((ulong)uVar28 >> 0x38);
  rhs_00.SubFormat[8] = (char)uVar29;
  rhs_00.SubFormat[9] = (char)((ulong)uVar29 >> 8);
  rhs_00.SubFormat[10] = (char)((ulong)uVar29 >> 0x10);
  rhs_00.SubFormat[0xb] = (char)((ulong)uVar29 >> 0x18);
  rhs_00.SubFormat[0xc] = (char)((ulong)uVar29 >> 0x20);
  rhs_00.SubFormat[0xd] = (char)((ulong)uVar29 >> 0x28);
  rhs_00.SubFormat[0xe] = (char)((ulong)uVar29 >> 0x30);
  rhs_00.SubFormat[0xf] = (char)((ulong)uVar29 >> 0x38);
  PrintExtensibleFmtChunk(rhs_00);
  memcpy(local_288,&wavHeader->BextChunk,0x270);
  puVar16 = local_288;
  puVar18 = (undefined8 *)&stack0xfffffffffffffa58;
  for (lVar14 = 0x4e; lVar14 != 0; lVar14 = lVar14 + -1) {
    *puVar18 = *puVar16;
    puVar16 = puVar16 + (ulong)bVar19 * -2 + 1;
    puVar18 = puVar18 + (ulong)bVar19 * -2 + 1;
  }
  rhs_02.ckSize._4_4_ = uVar21;
  rhs_02._0_8_ = uVar20;
  rhs_02.Description[0] = (char)uVar23;
  rhs_02.Description[1] = (char)((uint)uVar23 >> 8);
  rhs_02.Description[2] = (char)((uint)uVar23 >> 0x10);
  rhs_02.Description[3] = (char)((uint)uVar23 >> 0x18);
  rhs_02.Description[4] = (char)uVar24;
  rhs_02.Description[5] = (char)(uVar24 >> 8);
  rhs_02.Description[6] = (char)(uVar24 >> 0x10);
  rhs_02.Description[7] = (char)(uVar24 >> 0x18);
  rhs_02.Description[8] = (char)(uVar24 >> 0x20);
  rhs_02.Description[9] = (char)(uVar24 >> 0x28);
  rhs_02.Description[10] = (char)(uVar24 >> 0x30);
  rhs_02.Description[0xb] = (char)(uVar24 >> 0x38);
  rhs_02.Description[0xc] = (char)uVar25;
  rhs_02.Description[0xd] = (char)(uVar25 >> 8);
  rhs_02.Description[0xe] = (char)(uVar25 >> 0x10);
  rhs_02.Description[0xf] = (char)(uVar25 >> 0x18);
  rhs_02.Description[0x10] = (char)(uVar25 >> 0x20);
  rhs_02.Description[0x11] = (char)(uVar25 >> 0x28);
  rhs_02.Description[0x12] = (char)(uVar25 >> 0x30);
  rhs_02.Description[0x13] = (char)(uVar25 >> 0x38);
  rhs_02.Description[0x14] = (char)uVar26;
  rhs_02.Description[0x15] = (char)((ulong)uVar26 >> 8);
  rhs_02.Description[0x16] = (char)((ulong)uVar26 >> 0x10);
  rhs_02.Description[0x17] = (char)((ulong)uVar26 >> 0x18);
  rhs_02.Description[0x18] = (char)((ulong)uVar26 >> 0x20);
  rhs_02.Description[0x19] = (char)((ulong)uVar26 >> 0x28);
  rhs_02.Description[0x1a] = (char)((ulong)uVar26 >> 0x30);
  rhs_02.Description[0x1b] = (char)((ulong)uVar26 >> 0x38);
  rhs_02.Description[0x1c] = (char)uVar27;
  rhs_02.Description[0x1d] = (char)(uVar27 >> 8);
  rhs_02.Description[0x1e] = (char)(uVar27 >> 0x10);
  rhs_02.Description[0x1f] = (char)(uVar27 >> 0x18);
  rhs_02.Description[0x20] = (char)(uVar27 >> 0x20);
  rhs_02.Description[0x21] = (char)(uVar27 >> 0x28);
  rhs_02.Description[0x22] = (char)(uVar27 >> 0x30);
  rhs_02.Description[0x23] = (char)(uVar27 >> 0x38);
  rhs_02.Description[0x24] = (char)uVar28;
  rhs_02.Description[0x25] = (char)((ulong)uVar28 >> 8);
  rhs_02.Description[0x26] = (char)((ulong)uVar28 >> 0x10);
  rhs_02.Description[0x27] = (char)((ulong)uVar28 >> 0x18);
  rhs_02.Description[0x28] = (char)((ulong)uVar28 >> 0x20);
  rhs_02.Description[0x29] = (char)((ulong)uVar28 >> 0x28);
  rhs_02.Description[0x2a] = (char)((ulong)uVar28 >> 0x30);
  rhs_02.Description[0x2b] = (char)((ulong)uVar28 >> 0x38);
  rhs_02.Description[0x2c] = (char)uVar29;
  rhs_02.Description[0x2d] = (char)((ulong)uVar29 >> 8);
  rhs_02.Description[0x2e] = (char)((ulong)uVar29 >> 0x10);
  rhs_02.Description[0x2f] = (char)((ulong)uVar29 >> 0x18);
  rhs_02.Description[0x30] = (char)((ulong)uVar29 >> 0x20);
  rhs_02.Description[0x31] = (char)((ulong)uVar29 >> 0x28);
  rhs_02.Description[0x32] = (char)((ulong)uVar29 >> 0x30);
  rhs_02.Description[0x33] = (char)((ulong)uVar29 >> 0x38);
  rhs_02.Description[0x34] = (char)in_stack_fffffffffffffa98;
  rhs_02.Description[0x35] = (char)((uint)in_stack_fffffffffffffa98 >> 8);
  rhs_02.Description[0x36] = (char)((uint)in_stack_fffffffffffffa98 >> 0x10);
  rhs_02.Description[0x37] = (char)((uint)in_stack_fffffffffffffa98 >> 0x18);
  rhs_02.Description[0x38] = in_stack_fffffffffffffa9c[0];
  rhs_02.Description[0x39] = in_stack_fffffffffffffa9c[1];
  rhs_02.Description[0x3a] = in_stack_fffffffffffffa9c[2];
  rhs_02.Description[0x3b] = in_stack_fffffffffffffa9c[3];
  rhs_02.Description[0x3c] = in_stack_fffffffffffffa9c[4];
  rhs_02.Description[0x3d] = in_stack_fffffffffffffa9c[5];
  rhs_02.Description[0x3e] = in_stack_fffffffffffffa9c[6];
  rhs_02.Description[0x3f] = in_stack_fffffffffffffa9c[7];
  rhs_02.Description[0x40] = in_stack_fffffffffffffa9c[8];
  rhs_02.Description[0x41] = in_stack_fffffffffffffa9c[9];
  rhs_02.Description[0x42] = in_stack_fffffffffffffa9c[10];
  rhs_02.Description[0x43] = in_stack_fffffffffffffa9c[0xb];
  rhs_02.Description[0x44] = in_stack_fffffffffffffa9c[0xc];
  rhs_02.Description[0x45] = in_stack_fffffffffffffa9c[0xd];
  rhs_02.Description[0x46] = in_stack_fffffffffffffa9c[0xe];
  rhs_02.Description[0x47] = in_stack_fffffffffffffa9c[0xf];
  rhs_02.Description[0x48] = in_stack_fffffffffffffa9c[0x10];
  rhs_02.Description[0x49] = in_stack_fffffffffffffa9c[0x11];
  rhs_02.Description[0x4a] = in_stack_fffffffffffffa9c[0x12];
  rhs_02.Description[0x4b] = in_stack_fffffffffffffa9c[0x13];
  rhs_02.Description[0x4c] = in_stack_fffffffffffffa9c[0x14];
  rhs_02.Description[0x4d] = in_stack_fffffffffffffa9c[0x15];
  rhs_02.Description[0x4e] = in_stack_fffffffffffffa9c[0x16];
  rhs_02.Description[0x4f] = in_stack_fffffffffffffa9c[0x17];
  rhs_02.Description[0x50] = in_stack_fffffffffffffa9c[0x18];
  rhs_02.Description[0x51] = in_stack_fffffffffffffa9c[0x19];
  rhs_02.Description[0x52] = in_stack_fffffffffffffa9c[0x1a];
  rhs_02.Description[0x53] = in_stack_fffffffffffffa9c[0x1b];
  rhs_02.Description[0x54] = in_stack_fffffffffffffa9c[0x1c];
  rhs_02.Description[0x55] = in_stack_fffffffffffffa9c[0x1d];
  rhs_02.Description[0x56] = in_stack_fffffffffffffa9c[0x1e];
  rhs_02.Description[0x57] = in_stack_fffffffffffffa9c[0x1f];
  rhs_02.Description[0x58] = in_stack_fffffffffffffa9c[0x20];
  rhs_02.Description[0x59] = in_stack_fffffffffffffa9c[0x21];
  rhs_02.Description[0x5a] = in_stack_fffffffffffffa9c[0x22];
  rhs_02.Description[0x5b] = in_stack_fffffffffffffa9c[0x23];
  rhs_02.Description[0x5c] = in_stack_fffffffffffffa9c[0x24];
  rhs_02.Description[0x5d] = in_stack_fffffffffffffa9c[0x25];
  rhs_02.Description[0x5e] = in_stack_fffffffffffffa9c[0x26];
  rhs_02.Description[0x5f] = in_stack_fffffffffffffa9c[0x27];
  rhs_02.Description[0x60] = in_stack_fffffffffffffa9c[0x28];
  rhs_02.Description[0x61] = in_stack_fffffffffffffa9c[0x29];
  rhs_02.Description[0x62] = in_stack_fffffffffffffa9c[0x2a];
  rhs_02.Description[99] = in_stack_fffffffffffffa9c[0x2b];
  rhs_02.Description[100] = in_stack_fffffffffffffa9c[0x2c];
  rhs_02.Description[0x65] = in_stack_fffffffffffffa9c[0x2d];
  rhs_02.Description[0x66] = in_stack_fffffffffffffa9c[0x2e];
  rhs_02.Description[0x67] = in_stack_fffffffffffffa9c[0x2f];
  rhs_02.Description[0x68] = in_stack_fffffffffffffa9c[0x30];
  rhs_02.Description[0x69] = in_stack_fffffffffffffa9c[0x31];
  rhs_02.Description[0x6a] = in_stack_fffffffffffffa9c[0x32];
  rhs_02.Description[0x6b] = in_stack_fffffffffffffa9c[0x33];
  rhs_02.Description[0x6c] = in_stack_fffffffffffffa9c[0x34];
  rhs_02.Description[0x6d] = in_stack_fffffffffffffa9c[0x35];
  rhs_02.Description[0x6e] = in_stack_fffffffffffffa9c[0x36];
  rhs_02.Description[0x6f] = in_stack_fffffffffffffa9c[0x37];
  rhs_02.Description[0x70] = in_stack_fffffffffffffa9c[0x38];
  rhs_02.Description[0x71] = in_stack_fffffffffffffa9c[0x39];
  rhs_02.Description[0x72] = in_stack_fffffffffffffa9c[0x3a];
  rhs_02.Description[0x73] = in_stack_fffffffffffffa9c[0x3b];
  rhs_02.Description[0x74] = in_stack_fffffffffffffa9c[0x3c];
  rhs_02.Description[0x75] = in_stack_fffffffffffffa9c[0x3d];
  rhs_02.Description[0x76] = in_stack_fffffffffffffa9c[0x3e];
  rhs_02.Description[0x77] = in_stack_fffffffffffffa9c[0x3f];
  rhs_02.Description[0x78] = in_stack_fffffffffffffa9c[0x40];
  rhs_02.Description[0x79] = in_stack_fffffffffffffa9c[0x41];
  rhs_02.Description[0x7a] = in_stack_fffffffffffffa9c[0x42];
  rhs_02.Description[0x7b] = in_stack_fffffffffffffa9c[0x43];
  rhs_02.Description[0x7c] = in_stack_fffffffffffffa9c[0x44];
  rhs_02.Description[0x7d] = in_stack_fffffffffffffa9c[0x45];
  rhs_02.Description[0x7e] = in_stack_fffffffffffffa9c[0x46];
  rhs_02.Description[0x7f] = in_stack_fffffffffffffa9c[0x47];
  rhs_02.Description[0x80] = in_stack_fffffffffffffa9c[0x48];
  rhs_02.Description[0x81] = in_stack_fffffffffffffa9c[0x49];
  rhs_02.Description[0x82] = in_stack_fffffffffffffa9c[0x4a];
  rhs_02.Description[0x83] = in_stack_fffffffffffffa9c[0x4b];
  rhs_02.Description[0x84] = in_stack_fffffffffffffa9c[0x4c];
  rhs_02.Description[0x85] = in_stack_fffffffffffffa9c[0x4d];
  rhs_02.Description[0x86] = in_stack_fffffffffffffa9c[0x4e];
  rhs_02.Description[0x87] = in_stack_fffffffffffffa9c[0x4f];
  rhs_02.Description[0x88] = in_stack_fffffffffffffa9c[0x50];
  rhs_02.Description[0x89] = in_stack_fffffffffffffa9c[0x51];
  rhs_02.Description[0x8a] = in_stack_fffffffffffffa9c[0x52];
  rhs_02.Description[0x8b] = in_stack_fffffffffffffa9c[0x53];
  rhs_02.Description[0x8c] = in_stack_fffffffffffffa9c[0x54];
  rhs_02.Description[0x8d] = in_stack_fffffffffffffa9c[0x55];
  rhs_02.Description[0x8e] = in_stack_fffffffffffffa9c[0x56];
  rhs_02.Description[0x8f] = in_stack_fffffffffffffa9c[0x57];
  rhs_02.Description[0x90] = in_stack_fffffffffffffa9c[0x58];
  rhs_02.Description[0x91] = in_stack_fffffffffffffa9c[0x59];
  rhs_02.Description[0x92] = in_stack_fffffffffffffa9c[0x5a];
  rhs_02.Description[0x93] = in_stack_fffffffffffffa9c[0x5b];
  rhs_02.Description[0x94] = in_stack_fffffffffffffa9c[0x5c];
  rhs_02.Description[0x95] = in_stack_fffffffffffffa9c[0x5d];
  rhs_02.Description[0x96] = in_stack_fffffffffffffa9c[0x5e];
  rhs_02.Description[0x97] = in_stack_fffffffffffffa9c[0x5f];
  rhs_02.Description[0x98] = in_stack_fffffffffffffa9c[0x60];
  rhs_02.Description[0x99] = in_stack_fffffffffffffa9c[0x61];
  rhs_02.Description[0x9a] = in_stack_fffffffffffffa9c[0x62];
  rhs_02.Description[0x9b] = in_stack_fffffffffffffa9c[99];
  rhs_02.Description[0x9c] = in_stack_fffffffffffffa9c[100];
  rhs_02.Description[0x9d] = in_stack_fffffffffffffa9c[0x65];
  rhs_02.Description[0x9e] = in_stack_fffffffffffffa9c[0x66];
  rhs_02.Description[0x9f] = in_stack_fffffffffffffa9c[0x67];
  rhs_02.Description[0xa0] = in_stack_fffffffffffffa9c[0x68];
  rhs_02.Description[0xa1] = in_stack_fffffffffffffa9c[0x69];
  rhs_02.Description[0xa2] = in_stack_fffffffffffffa9c[0x6a];
  rhs_02.Description[0xa3] = in_stack_fffffffffffffa9c[0x6b];
  rhs_02.Description[0xa4] = in_stack_fffffffffffffa9c[0x6c];
  rhs_02.Description[0xa5] = in_stack_fffffffffffffa9c[0x6d];
  rhs_02.Description[0xa6] = in_stack_fffffffffffffa9c[0x6e];
  rhs_02.Description[0xa7] = in_stack_fffffffffffffa9c[0x6f];
  rhs_02.Description[0xa8] = in_stack_fffffffffffffa9c[0x70];
  rhs_02.Description[0xa9] = in_stack_fffffffffffffa9c[0x71];
  rhs_02.Description[0xaa] = in_stack_fffffffffffffa9c[0x72];
  rhs_02.Description[0xab] = in_stack_fffffffffffffa9c[0x73];
  rhs_02.Description[0xac] = in_stack_fffffffffffffa9c[0x74];
  rhs_02.Description[0xad] = in_stack_fffffffffffffa9c[0x75];
  rhs_02.Description[0xae] = in_stack_fffffffffffffa9c[0x76];
  rhs_02.Description[0xaf] = in_stack_fffffffffffffa9c[0x77];
  rhs_02.Description[0xb0] = in_stack_fffffffffffffa9c[0x78];
  rhs_02.Description[0xb1] = in_stack_fffffffffffffa9c[0x79];
  rhs_02.Description[0xb2] = in_stack_fffffffffffffa9c[0x7a];
  rhs_02.Description[0xb3] = in_stack_fffffffffffffa9c[0x7b];
  rhs_02.Description[0xb4] = in_stack_fffffffffffffa9c[0x7c];
  rhs_02.Description[0xb5] = in_stack_fffffffffffffa9c[0x7d];
  rhs_02.Description[0xb6] = in_stack_fffffffffffffa9c[0x7e];
  rhs_02.Description[0xb7] = in_stack_fffffffffffffa9c[0x7f];
  rhs_02.Description[0xb8] = in_stack_fffffffffffffa9c[0x80];
  rhs_02.Description[0xb9] = in_stack_fffffffffffffa9c[0x81];
  rhs_02.Description[0xba] = in_stack_fffffffffffffa9c[0x82];
  rhs_02.Description[0xbb] = in_stack_fffffffffffffa9c[0x83];
  rhs_02.Description[0xbc] = in_stack_fffffffffffffa9c[0x84];
  rhs_02.Description[0xbd] = in_stack_fffffffffffffa9c[0x85];
  rhs_02.Description[0xbe] = in_stack_fffffffffffffa9c[0x86];
  rhs_02.Description[0xbf] = in_stack_fffffffffffffa9c[0x87];
  rhs_02.Description[0xc0] = in_stack_fffffffffffffa9c[0x88];
  rhs_02.Description[0xc1] = in_stack_fffffffffffffa9c[0x89];
  rhs_02.Description[0xc2] = in_stack_fffffffffffffa9c[0x8a];
  rhs_02.Description[0xc3] = in_stack_fffffffffffffa9c[0x8b];
  rhs_02.Description[0xc4] = in_stack_fffffffffffffa9c[0x8c];
  rhs_02.Description[0xc5] = in_stack_fffffffffffffa9c[0x8d];
  rhs_02.Description[0xc6] = in_stack_fffffffffffffa9c[0x8e];
  rhs_02.Description[199] = in_stack_fffffffffffffa9c[0x8f];
  rhs_02.Description[200] = in_stack_fffffffffffffa9c[0x90];
  rhs_02.Description[0xc9] = in_stack_fffffffffffffa9c[0x91];
  rhs_02.Description[0xca] = in_stack_fffffffffffffa9c[0x92];
  rhs_02.Description[0xcb] = in_stack_fffffffffffffa9c[0x93];
  rhs_02.Description[0xcc] = in_stack_fffffffffffffa9c[0x94];
  rhs_02.Description[0xcd] = in_stack_fffffffffffffa9c[0x95];
  rhs_02.Description[0xce] = in_stack_fffffffffffffa9c[0x96];
  rhs_02.Description[0xcf] = in_stack_fffffffffffffa9c[0x97];
  rhs_02.Description[0xd0] = in_stack_fffffffffffffa9c[0x98];
  rhs_02.Description[0xd1] = in_stack_fffffffffffffa9c[0x99];
  rhs_02.Description[0xd2] = in_stack_fffffffffffffa9c[0x9a];
  rhs_02.Description[0xd3] = in_stack_fffffffffffffa9c[0x9b];
  rhs_02.Description[0xd4] = in_stack_fffffffffffffa9c[0x9c];
  rhs_02.Description[0xd5] = in_stack_fffffffffffffa9c[0x9d];
  rhs_02.Description[0xd6] = in_stack_fffffffffffffa9c[0x9e];
  rhs_02.Description[0xd7] = in_stack_fffffffffffffa9c[0x9f];
  rhs_02.Description[0xd8] = in_stack_fffffffffffffa9c[0xa0];
  rhs_02.Description[0xd9] = in_stack_fffffffffffffa9c[0xa1];
  rhs_02.Description[0xda] = in_stack_fffffffffffffa9c[0xa2];
  rhs_02.Description[0xdb] = in_stack_fffffffffffffa9c[0xa3];
  rhs_02.Description[0xdc] = in_stack_fffffffffffffa9c[0xa4];
  rhs_02.Description[0xdd] = in_stack_fffffffffffffa9c[0xa5];
  rhs_02.Description[0xde] = in_stack_fffffffffffffa9c[0xa6];
  rhs_02.Description[0xdf] = in_stack_fffffffffffffa9c[0xa7];
  rhs_02.Description[0xe0] = in_stack_fffffffffffffa9c[0xa8];
  rhs_02.Description[0xe1] = in_stack_fffffffffffffa9c[0xa9];
  rhs_02.Description[0xe2] = in_stack_fffffffffffffa9c[0xaa];
  rhs_02.Description[0xe3] = in_stack_fffffffffffffa9c[0xab];
  rhs_02.Description[0xe4] = in_stack_fffffffffffffa9c[0xac];
  rhs_02.Description[0xe5] = in_stack_fffffffffffffa9c[0xad];
  rhs_02.Description[0xe6] = in_stack_fffffffffffffa9c[0xae];
  rhs_02.Description[0xe7] = in_stack_fffffffffffffa9c[0xaf];
  rhs_02.Description[0xe8] = in_stack_fffffffffffffa9c[0xb0];
  rhs_02.Description[0xe9] = in_stack_fffffffffffffa9c[0xb1];
  rhs_02.Description[0xea] = in_stack_fffffffffffffa9c[0xb2];
  rhs_02.Description[0xeb] = in_stack_fffffffffffffa9c[0xb3];
  rhs_02.Description[0xec] = in_stack_fffffffffffffa9c[0xb4];
  rhs_02.Description[0xed] = in_stack_fffffffffffffa9c[0xb5];
  rhs_02.Description[0xee] = in_stack_fffffffffffffa9c[0xb6];
  rhs_02.Description[0xef] = in_stack_fffffffffffffa9c[0xb7];
  rhs_02.Description[0xf0] = in_stack_fffffffffffffa9c[0xb8];
  rhs_02.Description[0xf1] = in_stack_fffffffffffffa9c[0xb9];
  rhs_02.Description[0xf2] = in_stack_fffffffffffffa9c[0xba];
  rhs_02.Description[0xf3] = in_stack_fffffffffffffa9c[0xbb];
  rhs_02.Description[0xf4] = in_stack_fffffffffffffa9c[0xbc];
  rhs_02.Description[0xf5] = in_stack_fffffffffffffa9c[0xbd];
  rhs_02.Description[0xf6] = in_stack_fffffffffffffa9c[0xbe];
  rhs_02.Description[0xf7] = in_stack_fffffffffffffa9c[0xbf];
  rhs_02.Description[0xf8] = in_stack_fffffffffffffa9c[0xc0];
  rhs_02.Description[0xf9] = in_stack_fffffffffffffa9c[0xc1];
  rhs_02.Description[0xfa] = in_stack_fffffffffffffa9c[0xc2];
  rhs_02.Description[0xfb] = in_stack_fffffffffffffa9c[0xc3];
  rhs_02.Description[0xfc] = in_stack_fffffffffffffa9c[0xc4];
  rhs_02.Description[0xfd] = in_stack_fffffffffffffa9c[0xc5];
  rhs_02.Description[0xfe] = in_stack_fffffffffffffa9c[0xc6];
  rhs_02.Description[0xff] = in_stack_fffffffffffffa9c[199];
  rhs_02.Originator[0] = in_stack_fffffffffffffa9c[200];
  rhs_02.Originator[1] = in_stack_fffffffffffffa9c[0xc9];
  rhs_02.Originator[2] = in_stack_fffffffffffffa9c[0xca];
  rhs_02.Originator[3] = in_stack_fffffffffffffa9c[0xcb];
  rhs_02.Originator[4] = in_stack_fffffffffffffa9c[0xcc];
  rhs_02.Originator[5] = in_stack_fffffffffffffa9c[0xcd];
  rhs_02.Originator[6] = in_stack_fffffffffffffa9c[0xce];
  rhs_02.Originator[7] = in_stack_fffffffffffffa9c[0xcf];
  rhs_02.Originator[8] = in_stack_fffffffffffffa9c[0xd0];
  rhs_02.Originator[9] = in_stack_fffffffffffffa9c[0xd1];
  rhs_02.Originator[10] = in_stack_fffffffffffffa9c[0xd2];
  rhs_02.Originator[0xb] = in_stack_fffffffffffffa9c[0xd3];
  rhs_02.Originator[0xc] = in_stack_fffffffffffffa9c[0xd4];
  rhs_02.Originator[0xd] = in_stack_fffffffffffffa9c[0xd5];
  rhs_02.Originator[0xe] = in_stack_fffffffffffffa9c[0xd6];
  rhs_02.Originator[0xf] = in_stack_fffffffffffffa9c[0xd7];
  rhs_02.Originator[0x10] = in_stack_fffffffffffffa9c[0xd8];
  rhs_02.Originator[0x11] = in_stack_fffffffffffffa9c[0xd9];
  rhs_02.Originator[0x12] = in_stack_fffffffffffffa9c[0xda];
  rhs_02.Originator[0x13] = in_stack_fffffffffffffa9c[0xdb];
  rhs_02.Originator[0x14] = in_stack_fffffffffffffa9c[0xdc];
  rhs_02.Originator[0x15] = in_stack_fffffffffffffa9c[0xdd];
  rhs_02.Originator[0x16] = in_stack_fffffffffffffa9c[0xde];
  rhs_02.Originator[0x17] = in_stack_fffffffffffffa9c[0xdf];
  rhs_02.Originator[0x18] = in_stack_fffffffffffffa9c[0xe0];
  rhs_02.Originator[0x19] = in_stack_fffffffffffffa9c[0xe1];
  rhs_02.Originator[0x1a] = in_stack_fffffffffffffa9c[0xe2];
  rhs_02.Originator[0x1b] = in_stack_fffffffffffffa9c[0xe3];
  rhs_02.Originator[0x1c] = in_stack_fffffffffffffa9c[0xe4];
  rhs_02.Originator[0x1d] = in_stack_fffffffffffffa9c[0xe5];
  rhs_02.Originator[0x1e] = in_stack_fffffffffffffa9c[0xe6];
  rhs_02.Originator[0x1f] = in_stack_fffffffffffffa9c[0xe7];
  rhs_02.OriginatorReference[0] = in_stack_fffffffffffffa9c[0xe8];
  rhs_02.OriginatorReference[1] = in_stack_fffffffffffffa9c[0xe9];
  rhs_02.OriginatorReference[2] = in_stack_fffffffffffffa9c[0xea];
  rhs_02.OriginatorReference[3] = in_stack_fffffffffffffa9c[0xeb];
  rhs_02.OriginatorReference[4] = in_stack_fffffffffffffa9c[0xec];
  rhs_02.OriginatorReference[5] = in_stack_fffffffffffffa9c[0xed];
  rhs_02.OriginatorReference[6] = in_stack_fffffffffffffa9c[0xee];
  rhs_02.OriginatorReference[7] = in_stack_fffffffffffffa9c[0xef];
  rhs_02.OriginatorReference[8] = in_stack_fffffffffffffa9c[0xf0];
  rhs_02.OriginatorReference[9] = in_stack_fffffffffffffa9c[0xf1];
  rhs_02.OriginatorReference[10] = in_stack_fffffffffffffa9c[0xf2];
  rhs_02.OriginatorReference[0xb] = in_stack_fffffffffffffa9c[0xf3];
  rhs_02.OriginatorReference[0xc] = in_stack_fffffffffffffa9c[0xf4];
  rhs_02.OriginatorReference[0xd] = in_stack_fffffffffffffa9c[0xf5];
  rhs_02.OriginatorReference[0xe] = in_stack_fffffffffffffa9c[0xf6];
  rhs_02.OriginatorReference[0xf] = in_stack_fffffffffffffa9c[0xf7];
  rhs_02.OriginatorReference[0x10] = in_stack_fffffffffffffa9c[0xf8];
  rhs_02.OriginatorReference[0x11] = in_stack_fffffffffffffa9c[0xf9];
  rhs_02.OriginatorReference[0x12] = in_stack_fffffffffffffa9c[0xfa];
  rhs_02.OriginatorReference[0x13] = in_stack_fffffffffffffa9c[0xfb];
  rhs_02.OriginatorReference[0x14] = in_stack_fffffffffffffa9c[0xfc];
  rhs_02.OriginatorReference[0x15] = in_stack_fffffffffffffa9c[0xfd];
  rhs_02.OriginatorReference[0x16] = in_stack_fffffffffffffa9c[0xfe];
  rhs_02.OriginatorReference[0x17] = in_stack_fffffffffffffa9c[0xff];
  rhs_02.OriginatorReference[0x18] = in_stack_fffffffffffffa9c[0x100];
  rhs_02.OriginatorReference[0x19] = in_stack_fffffffffffffa9c[0x101];
  rhs_02.OriginatorReference[0x1a] = in_stack_fffffffffffffa9c[0x102];
  rhs_02.OriginatorReference[0x1b] = in_stack_fffffffffffffa9c[0x103];
  rhs_02.OriginatorReference[0x1c] = in_stack_fffffffffffffa9c[0x104];
  rhs_02.OriginatorReference[0x1d] = in_stack_fffffffffffffa9c[0x105];
  rhs_02.OriginatorReference[0x1e] = in_stack_fffffffffffffa9c[0x106];
  rhs_02.OriginatorReference[0x1f] = in_stack_fffffffffffffa9c[0x107];
  rhs_02.OriginationDate[0] = in_stack_fffffffffffffa9c[0x108];
  rhs_02.OriginationDate[1] = in_stack_fffffffffffffa9c[0x109];
  rhs_02.OriginationDate[2] = in_stack_fffffffffffffa9c[0x10a];
  rhs_02.OriginationDate[3] = in_stack_fffffffffffffa9c[0x10b];
  rhs_02.OriginationDate[4] = in_stack_fffffffffffffa9c[0x10c];
  rhs_02.OriginationDate[5] = in_stack_fffffffffffffa9c[0x10d];
  rhs_02.OriginationDate[6] = in_stack_fffffffffffffa9c[0x10e];
  rhs_02.OriginationDate[7] = in_stack_fffffffffffffa9c[0x10f];
  rhs_02.OriginationDate[8] = in_stack_fffffffffffffa9c[0x110];
  rhs_02.OriginationDate[9] = in_stack_fffffffffffffa9c[0x111];
  rhs_02.OriginationTime[0] = in_stack_fffffffffffffa9c[0x112];
  rhs_02.OriginationTime[1] = in_stack_fffffffffffffa9c[0x113];
  rhs_02.OriginationTime[2] = in_stack_fffffffffffffa9c[0x114];
  rhs_02.OriginationTime[3] = in_stack_fffffffffffffa9c[0x115];
  rhs_02.OriginationTime[4] = in_stack_fffffffffffffa9c[0x116];
  rhs_02.OriginationTime[5] = in_stack_fffffffffffffa9c[0x117];
  rhs_02.OriginationTime[6] = in_stack_fffffffffffffa9c[0x118];
  rhs_02.OriginationTime[7] = in_stack_fffffffffffffa9c[0x119];
  rhs_02.Align = in_stack_fffffffffffffa9c._282_2_;
  rhs_02.TimeReferenceLow = in_stack_fffffffffffffa9c._284_8_;
  rhs_02.TimeReferenceHigh = in_stack_fffffffffffffa9c._292_8_;
  rhs_02.Version = in_stack_fffffffffffffa9c._300_2_;
  rhs_02.UMID[0] = in_stack_fffffffffffffa9c[0x12e];
  rhs_02.UMID[1] = in_stack_fffffffffffffa9c[0x12f];
  rhs_02.UMID[2] = in_stack_fffffffffffffa9c[0x130];
  rhs_02.UMID[3] = in_stack_fffffffffffffa9c[0x131];
  rhs_02.UMID[4] = in_stack_fffffffffffffa9c[0x132];
  rhs_02.UMID[5] = in_stack_fffffffffffffa9c[0x133];
  rhs_02.UMID[6] = in_stack_fffffffffffffa9c[0x134];
  rhs_02.UMID[7] = in_stack_fffffffffffffa9c[0x135];
  rhs_02.UMID[8] = in_stack_fffffffffffffa9c[0x136];
  rhs_02.UMID[9] = in_stack_fffffffffffffa9c[0x137];
  rhs_02.UMID[10] = in_stack_fffffffffffffa9c[0x138];
  rhs_02.UMID[0xb] = in_stack_fffffffffffffa9c[0x139];
  rhs_02.UMID[0xc] = in_stack_fffffffffffffa9c[0x13a];
  rhs_02.UMID[0xd] = in_stack_fffffffffffffa9c[0x13b];
  rhs_02.UMID[0xe] = in_stack_fffffffffffffa9c[0x13c];
  rhs_02.UMID[0xf] = in_stack_fffffffffffffa9c[0x13d];
  rhs_02.UMID[0x10] = in_stack_fffffffffffffa9c[0x13e];
  rhs_02.UMID[0x11] = in_stack_fffffffffffffa9c[0x13f];
  rhs_02.UMID[0x12] = in_stack_fffffffffffffa9c[0x140];
  rhs_02.UMID[0x13] = in_stack_fffffffffffffa9c[0x141];
  rhs_02.UMID[0x14] = in_stack_fffffffffffffa9c[0x142];
  rhs_02.UMID[0x15] = in_stack_fffffffffffffa9c[0x143];
  rhs_02.UMID[0x16] = in_stack_fffffffffffffa9c[0x144];
  rhs_02.UMID[0x17] = in_stack_fffffffffffffa9c[0x145];
  rhs_02.UMID[0x18] = in_stack_fffffffffffffa9c[0x146];
  rhs_02.UMID[0x19] = in_stack_fffffffffffffa9c[0x147];
  rhs_02.UMID[0x1a] = in_stack_fffffffffffffa9c[0x148];
  rhs_02.UMID[0x1b] = in_stack_fffffffffffffa9c[0x149];
  rhs_02.UMID[0x1c] = in_stack_fffffffffffffa9c[0x14a];
  rhs_02.UMID[0x1d] = in_stack_fffffffffffffa9c[0x14b];
  rhs_02.UMID[0x1e] = in_stack_fffffffffffffa9c[0x14c];
  rhs_02.UMID[0x1f] = in_stack_fffffffffffffa9c[0x14d];
  rhs_02.UMID[0x20] = in_stack_fffffffffffffa9c[0x14e];
  rhs_02.UMID[0x21] = in_stack_fffffffffffffa9c[0x14f];
  rhs_02.UMID[0x22] = in_stack_fffffffffffffa9c[0x150];
  rhs_02.UMID[0x23] = in_stack_fffffffffffffa9c[0x151];
  rhs_02.UMID[0x24] = in_stack_fffffffffffffa9c[0x152];
  rhs_02.UMID[0x25] = in_stack_fffffffffffffa9c[0x153];
  rhs_02.UMID[0x26] = in_stack_fffffffffffffa9c[0x154];
  rhs_02.UMID[0x27] = in_stack_fffffffffffffa9c[0x155];
  rhs_02.UMID[0x28] = in_stack_fffffffffffffa9c[0x156];
  rhs_02.UMID[0x29] = in_stack_fffffffffffffa9c[0x157];
  rhs_02.UMID[0x2a] = in_stack_fffffffffffffa9c[0x158];
  rhs_02.UMID[0x2b] = in_stack_fffffffffffffa9c[0x159];
  rhs_02.UMID[0x2c] = in_stack_fffffffffffffa9c[0x15a];
  rhs_02.UMID[0x2d] = in_stack_fffffffffffffa9c[0x15b];
  rhs_02.UMID[0x2e] = in_stack_fffffffffffffa9c[0x15c];
  rhs_02.UMID[0x2f] = in_stack_fffffffffffffa9c[0x15d];
  rhs_02.UMID[0x30] = in_stack_fffffffffffffa9c[0x15e];
  rhs_02.UMID[0x31] = in_stack_fffffffffffffa9c[0x15f];
  rhs_02.UMID[0x32] = in_stack_fffffffffffffa9c[0x160];
  rhs_02.UMID[0x33] = in_stack_fffffffffffffa9c[0x161];
  rhs_02.UMID[0x34] = in_stack_fffffffffffffa9c[0x162];
  rhs_02.UMID[0x35] = in_stack_fffffffffffffa9c[0x163];
  rhs_02.UMID[0x36] = in_stack_fffffffffffffa9c[0x164];
  rhs_02.UMID[0x37] = in_stack_fffffffffffffa9c[0x165];
  rhs_02.UMID[0x38] = in_stack_fffffffffffffa9c[0x166];
  rhs_02.UMID[0x39] = in_stack_fffffffffffffa9c[0x167];
  rhs_02.UMID[0x3a] = in_stack_fffffffffffffa9c[0x168];
  rhs_02.UMID[0x3b] = in_stack_fffffffffffffa9c[0x169];
  rhs_02.UMID[0x3c] = in_stack_fffffffffffffa9c[0x16a];
  rhs_02.UMID[0x3d] = in_stack_fffffffffffffa9c[0x16b];
  rhs_02.UMID[0x3e] = in_stack_fffffffffffffa9c[0x16c];
  rhs_02.UMID[0x3f] = in_stack_fffffffffffffa9c[0x16d];
  rhs_02.LoudnessValue = in_stack_fffffffffffffa9c._366_2_;
  rhs_02.LoudnessRange = in_stack_fffffffffffffa9c._368_2_;
  rhs_02.MaxTruePeakLevel = in_stack_fffffffffffffa9c._370_2_;
  rhs_02.MaxMomentaryLoudness = in_stack_fffffffffffffa9c._372_2_;
  rhs_02.MaxShortTermLoudness = in_stack_fffffffffffffa9c._374_2_;
  rhs_02.Reserved[0] = in_stack_fffffffffffffa9c[0x178];
  rhs_02.Reserved[1] = in_stack_fffffffffffffa9c[0x179];
  rhs_02.Reserved[2] = in_stack_fffffffffffffa9c[0x17a];
  rhs_02.Reserved[3] = in_stack_fffffffffffffa9c[0x17b];
  rhs_02.Reserved[4] = in_stack_fffffffffffffa9c[0x17c];
  rhs_02.Reserved[5] = in_stack_fffffffffffffa9c[0x17d];
  rhs_02.Reserved[6] = in_stack_fffffffffffffa9c[0x17e];
  rhs_02.Reserved[7] = in_stack_fffffffffffffa9c[0x17f];
  rhs_02.Reserved[8] = in_stack_fffffffffffffa9c[0x180];
  rhs_02.Reserved[9] = in_stack_fffffffffffffa9c[0x181];
  rhs_02.Reserved[10] = in_stack_fffffffffffffa9c[0x182];
  rhs_02.Reserved[0xb] = in_stack_fffffffffffffa9c[0x183];
  rhs_02.Reserved[0xc] = in_stack_fffffffffffffa9c[0x184];
  rhs_02.Reserved[0xd] = in_stack_fffffffffffffa9c[0x185];
  rhs_02.Reserved[0xe] = in_stack_fffffffffffffa9c[0x186];
  rhs_02.Reserved[0xf] = in_stack_fffffffffffffa9c[0x187];
  rhs_02.Reserved[0x10] = in_stack_fffffffffffffa9c[0x188];
  rhs_02.Reserved[0x11] = in_stack_fffffffffffffa9c[0x189];
  rhs_02.Reserved[0x12] = in_stack_fffffffffffffa9c[0x18a];
  rhs_02.Reserved[0x13] = in_stack_fffffffffffffa9c[0x18b];
  rhs_02.Reserved[0x14] = in_stack_fffffffffffffa9c[0x18c];
  rhs_02.Reserved[0x15] = in_stack_fffffffffffffa9c[0x18d];
  rhs_02.Reserved[0x16] = in_stack_fffffffffffffa9c[0x18e];
  rhs_02.Reserved[0x17] = in_stack_fffffffffffffa9c[399];
  rhs_02.Reserved[0x18] = in_stack_fffffffffffffa9c[400];
  rhs_02.Reserved[0x19] = in_stack_fffffffffffffa9c[0x191];
  rhs_02.Reserved[0x1a] = in_stack_fffffffffffffa9c[0x192];
  rhs_02.Reserved[0x1b] = in_stack_fffffffffffffa9c[0x193];
  rhs_02.Reserved[0x1c] = in_stack_fffffffffffffa9c[0x194];
  rhs_02.Reserved[0x1d] = in_stack_fffffffffffffa9c[0x195];
  rhs_02.Reserved[0x1e] = in_stack_fffffffffffffa9c[0x196];
  rhs_02.Reserved[0x1f] = in_stack_fffffffffffffa9c[0x197];
  rhs_02.Reserved[0x20] = in_stack_fffffffffffffa9c[0x198];
  rhs_02.Reserved[0x21] = in_stack_fffffffffffffa9c[0x199];
  rhs_02.Reserved[0x22] = in_stack_fffffffffffffa9c[0x19a];
  rhs_02.Reserved[0x23] = in_stack_fffffffffffffa9c[0x19b];
  rhs_02.Reserved[0x24] = in_stack_fffffffffffffa9c[0x19c];
  rhs_02.Reserved[0x25] = in_stack_fffffffffffffa9c[0x19d];
  rhs_02.Reserved[0x26] = in_stack_fffffffffffffa9c[0x19e];
  rhs_02.Reserved[0x27] = in_stack_fffffffffffffa9c[0x19f];
  rhs_02.Reserved[0x28] = in_stack_fffffffffffffa9c[0x1a0];
  rhs_02.Reserved[0x29] = in_stack_fffffffffffffa9c[0x1a1];
  rhs_02.Reserved[0x2a] = in_stack_fffffffffffffa9c[0x1a2];
  rhs_02.Reserved[0x2b] = in_stack_fffffffffffffa9c[0x1a3];
  rhs_02.Reserved[0x2c] = in_stack_fffffffffffffa9c[0x1a4];
  rhs_02.Reserved[0x2d] = in_stack_fffffffffffffa9c[0x1a5];
  rhs_02.Reserved[0x2e] = in_stack_fffffffffffffa9c[0x1a6];
  rhs_02.Reserved[0x2f] = in_stack_fffffffffffffa9c[0x1a7];
  rhs_02.Reserved[0x30] = in_stack_fffffffffffffa9c[0x1a8];
  rhs_02.Reserved[0x31] = in_stack_fffffffffffffa9c[0x1a9];
  rhs_02.Reserved[0x32] = in_stack_fffffffffffffa9c[0x1aa];
  rhs_02.Reserved[0x33] = in_stack_fffffffffffffa9c[0x1ab];
  rhs_02.Reserved[0x34] = in_stack_fffffffffffffa9c[0x1ac];
  rhs_02.Reserved[0x35] = in_stack_fffffffffffffa9c[0x1ad];
  rhs_02.Reserved[0x36] = in_stack_fffffffffffffa9c[0x1ae];
  rhs_02.Reserved[0x37] = in_stack_fffffffffffffa9c[0x1af];
  rhs_02.Reserved[0x38] = in_stack_fffffffffffffa9c[0x1b0];
  rhs_02.Reserved[0x39] = in_stack_fffffffffffffa9c[0x1b1];
  rhs_02.Reserved[0x3a] = in_stack_fffffffffffffa9c[0x1b2];
  rhs_02.Reserved[0x3b] = in_stack_fffffffffffffa9c[0x1b3];
  rhs_02.Reserved[0x3c] = in_stack_fffffffffffffa9c[0x1b4];
  rhs_02.Reserved[0x3d] = in_stack_fffffffffffffa9c[0x1b5];
  rhs_02.Reserved[0x3e] = in_stack_fffffffffffffa9c[0x1b6];
  rhs_02.Reserved[0x3f] = in_stack_fffffffffffffa9c[0x1b7];
  rhs_02.Reserved[0x40] = in_stack_fffffffffffffa9c[0x1b8];
  rhs_02.Reserved[0x41] = in_stack_fffffffffffffa9c[0x1b9];
  rhs_02.Reserved[0x42] = in_stack_fffffffffffffa9c[0x1ba];
  rhs_02.Reserved[0x43] = in_stack_fffffffffffffa9c[0x1bb];
  rhs_02.Reserved[0x44] = in_stack_fffffffffffffa9c[0x1bc];
  rhs_02.Reserved[0x45] = in_stack_fffffffffffffa9c[0x1bd];
  rhs_02.Reserved[0x46] = in_stack_fffffffffffffa9c[0x1be];
  rhs_02.Reserved[0x47] = in_stack_fffffffffffffa9c[0x1bf];
  rhs_02.Reserved[0x48] = in_stack_fffffffffffffa9c[0x1c0];
  rhs_02.Reserved[0x49] = in_stack_fffffffffffffa9c[0x1c1];
  rhs_02.Reserved[0x4a] = in_stack_fffffffffffffa9c[0x1c2];
  rhs_02.Reserved[0x4b] = in_stack_fffffffffffffa9c[0x1c3];
  rhs_02.Reserved[0x4c] = in_stack_fffffffffffffa9c[0x1c4];
  rhs_02.Reserved[0x4d] = in_stack_fffffffffffffa9c[0x1c5];
  rhs_02.Reserved[0x4e] = in_stack_fffffffffffffa9c[0x1c6];
  rhs_02.Reserved[0x4f] = in_stack_fffffffffffffa9c[0x1c7];
  rhs_02.Reserved[0x50] = in_stack_fffffffffffffa9c[0x1c8];
  rhs_02.Reserved[0x51] = in_stack_fffffffffffffa9c[0x1c9];
  rhs_02.Reserved[0x52] = in_stack_fffffffffffffa9c[0x1ca];
  rhs_02.Reserved[0x53] = in_stack_fffffffffffffa9c[0x1cb];
  rhs_02.Reserved[0x54] = in_stack_fffffffffffffa9c[0x1cc];
  rhs_02.Reserved[0x55] = in_stack_fffffffffffffa9c[0x1cd];
  rhs_02.Reserved[0x56] = in_stack_fffffffffffffa9c[0x1ce];
  rhs_02.Reserved[0x57] = in_stack_fffffffffffffa9c[0x1cf];
  rhs_02.Reserved[0x58] = in_stack_fffffffffffffa9c[0x1d0];
  rhs_02.Reserved[0x59] = in_stack_fffffffffffffa9c[0x1d1];
  rhs_02.Reserved[0x5a] = in_stack_fffffffffffffa9c[0x1d2];
  rhs_02.Reserved[0x5b] = in_stack_fffffffffffffa9c[0x1d3];
  rhs_02.Reserved[0x5c] = in_stack_fffffffffffffa9c[0x1d4];
  rhs_02.Reserved[0x5d] = in_stack_fffffffffffffa9c[0x1d5];
  rhs_02.Reserved[0x5e] = in_stack_fffffffffffffa9c[0x1d6];
  rhs_02.Reserved[0x5f] = in_stack_fffffffffffffa9c[0x1d7];
  rhs_02.Reserved[0x60] = in_stack_fffffffffffffa9c[0x1d8];
  rhs_02.Reserved[0x61] = in_stack_fffffffffffffa9c[0x1d9];
  rhs_02.Reserved[0x62] = in_stack_fffffffffffffa9c[0x1da];
  rhs_02.Reserved[99] = in_stack_fffffffffffffa9c[0x1db];
  rhs_02.Reserved[100] = in_stack_fffffffffffffa9c[0x1dc];
  rhs_02.Reserved[0x65] = in_stack_fffffffffffffa9c[0x1dd];
  rhs_02.Reserved[0x66] = in_stack_fffffffffffffa9c[0x1de];
  rhs_02.Reserved[0x67] = in_stack_fffffffffffffa9c[0x1df];
  rhs_02.Reserved[0x68] = in_stack_fffffffffffffa9c[0x1e0];
  rhs_02.Reserved[0x69] = in_stack_fffffffffffffa9c[0x1e1];
  rhs_02.Reserved[0x6a] = in_stack_fffffffffffffa9c[0x1e2];
  rhs_02.Reserved[0x6b] = in_stack_fffffffffffffa9c[0x1e3];
  rhs_02.Reserved[0x6c] = in_stack_fffffffffffffa9c[0x1e4];
  rhs_02.Reserved[0x6d] = in_stack_fffffffffffffa9c[0x1e5];
  rhs_02.Reserved[0x6e] = in_stack_fffffffffffffa9c[0x1e6];
  rhs_02.Reserved[0x6f] = in_stack_fffffffffffffa9c[0x1e7];
  rhs_02.Reserved[0x70] = in_stack_fffffffffffffa9c[0x1e8];
  rhs_02.Reserved[0x71] = in_stack_fffffffffffffa9c[0x1e9];
  rhs_02.Reserved[0x72] = in_stack_fffffffffffffa9c[0x1ea];
  rhs_02.Reserved[0x73] = in_stack_fffffffffffffa9c[0x1eb];
  rhs_02.Reserved[0x74] = in_stack_fffffffffffffa9c[0x1ec];
  rhs_02.Reserved[0x75] = in_stack_fffffffffffffa9c[0x1ed];
  rhs_02.Reserved[0x76] = in_stack_fffffffffffffa9c[0x1ee];
  rhs_02.Reserved[0x77] = in_stack_fffffffffffffa9c[0x1ef];
  rhs_02.Reserved[0x78] = in_stack_fffffffffffffa9c[0x1f0];
  rhs_02.Reserved[0x79] = in_stack_fffffffffffffa9c[0x1f1];
  rhs_02.Reserved[0x7a] = in_stack_fffffffffffffa9c[0x1f2];
  rhs_02.Reserved[0x7b] = in_stack_fffffffffffffa9c[499];
  rhs_02.Reserved[0x7c] = in_stack_fffffffffffffa9c[500];
  rhs_02.Reserved[0x7d] = in_stack_fffffffffffffa9c[0x1f5];
  rhs_02.Reserved[0x7e] = in_stack_fffffffffffffa9c[0x1f6];
  rhs_02.Reserved[0x7f] = in_stack_fffffffffffffa9c[0x1f7];
  rhs_02.Reserved[0x80] = in_stack_fffffffffffffa9c[0x1f8];
  rhs_02.Reserved[0x81] = in_stack_fffffffffffffa9c[0x1f9];
  rhs_02.Reserved[0x82] = in_stack_fffffffffffffa9c[0x1fa];
  rhs_02.Reserved[0x83] = in_stack_fffffffffffffa9c[0x1fb];
  rhs_02.Reserved[0x84] = in_stack_fffffffffffffa9c[0x1fc];
  rhs_02.Reserved[0x85] = in_stack_fffffffffffffa9c[0x1fd];
  rhs_02.Reserved[0x86] = in_stack_fffffffffffffa9c[0x1fe];
  rhs_02.Reserved[0x87] = in_stack_fffffffffffffa9c[0x1ff];
  rhs_02.Reserved[0x88] = in_stack_fffffffffffffa9c[0x200];
  rhs_02.Reserved[0x89] = in_stack_fffffffffffffa9c[0x201];
  rhs_02.Reserved[0x8a] = in_stack_fffffffffffffa9c[0x202];
  rhs_02.Reserved[0x8b] = in_stack_fffffffffffffa9c[0x203];
  rhs_02.Reserved[0x8c] = in_stack_fffffffffffffa9c[0x204];
  rhs_02.Reserved[0x8d] = in_stack_fffffffffffffa9c[0x205];
  rhs_02.Reserved[0x8e] = in_stack_fffffffffffffa9c[0x206];
  rhs_02.Reserved[0x8f] = in_stack_fffffffffffffa9c[0x207];
  rhs_02.Reserved[0x90] = in_stack_fffffffffffffa9c[0x208];
  rhs_02.Reserved[0x91] = in_stack_fffffffffffffa9c[0x209];
  rhs_02.Reserved[0x92] = in_stack_fffffffffffffa9c[0x20a];
  rhs_02.Reserved[0x93] = in_stack_fffffffffffffa9c[0x20b];
  rhs_02.Reserved[0x94] = in_stack_fffffffffffffa9c[0x20c];
  rhs_02.Reserved[0x95] = in_stack_fffffffffffffa9c[0x20d];
  rhs_02.Reserved[0x96] = in_stack_fffffffffffffa9c[0x20e];
  rhs_02.Reserved[0x97] = in_stack_fffffffffffffa9c[0x20f];
  rhs_02.Reserved[0x98] = in_stack_fffffffffffffa9c[0x210];
  rhs_02.Reserved[0x99] = in_stack_fffffffffffffa9c[0x211];
  rhs_02.Reserved[0x9a] = in_stack_fffffffffffffa9c[0x212];
  rhs_02.Reserved[0x9b] = in_stack_fffffffffffffa9c[0x213];
  rhs_02.Reserved[0x9c] = in_stack_fffffffffffffa9c[0x214];
  rhs_02.Reserved[0x9d] = in_stack_fffffffffffffa9c[0x215];
  rhs_02.Reserved[0x9e] = in_stack_fffffffffffffa9c[0x216];
  rhs_02.Reserved[0x9f] = in_stack_fffffffffffffa9c[0x217];
  rhs_02.Reserved[0xa0] = in_stack_fffffffffffffa9c[0x218];
  rhs_02.Reserved[0xa1] = in_stack_fffffffffffffa9c[0x219];
  rhs_02.Reserved[0xa2] = in_stack_fffffffffffffa9c[0x21a];
  rhs_02.Reserved[0xa3] = in_stack_fffffffffffffa9c[0x21b];
  rhs_02.Reserved[0xa4] = in_stack_fffffffffffffa9c[0x21c];
  rhs_02.Reserved[0xa5] = in_stack_fffffffffffffa9c[0x21d];
  rhs_02.Reserved[0xa6] = in_stack_fffffffffffffa9c[0x21e];
  rhs_02.Reserved[0xa7] = in_stack_fffffffffffffa9c[0x21f];
  rhs_02.Reserved[0xa8] = in_stack_fffffffffffffa9c[0x220];
  rhs_02.Reserved[0xa9] = in_stack_fffffffffffffa9c[0x221];
  rhs_02.Reserved[0xaa] = in_stack_fffffffffffffa9c[0x222];
  rhs_02.Reserved[0xab] = in_stack_fffffffffffffa9c[0x223];
  rhs_02.Reserved[0xac] = in_stack_fffffffffffffa9c[0x224];
  rhs_02.Reserved[0xad] = in_stack_fffffffffffffa9c[0x225];
  rhs_02.Reserved[0xae] = in_stack_fffffffffffffa9c[0x226];
  rhs_02.Reserved[0xaf] = in_stack_fffffffffffffa9c[0x227];
  rhs_02.Reserved[0xb0] = in_stack_fffffffffffffa9c[0x228];
  rhs_02.Reserved[0xb1] = in_stack_fffffffffffffa9c[0x229];
  rhs_02.Reserved[0xb2] = in_stack_fffffffffffffa9c[0x22a];
  rhs_02.Reserved[0xb3] = in_stack_fffffffffffffa9c[0x22b];
  PrintBextChunk(rhs_02);
  PrintDataChunk(wavHeader->DataChunk);
  return;
}

Assistant:

void WavParserHelper::PrintRF64Header(RF64Header *wavHeader)
{
	PrintRF64Chunk(wavHeader->RF64Chunk);
	PrintDS64Chunk(wavHeader->DS64Chunk);
	PrintExtensibleFmtChunk(wavHeader->fmtChunk);
	PrintBextChunk(wavHeader->BextChunk);
	//PrintJunkChunk(wavHeader->JunkChunk);
	PrintDataChunk(wavHeader->DataChunk);
}